

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O3

void printFuncHeaderDoc(FILE *out,TA_FuncInfo *funcInfo,char *prefix)

{
  double dVar1;
  TA_InputParameterType TVar2;
  TA_RetCode TVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  TA_InputParameterInfo *inputParamInfo;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_OutputParameterInfo *outputParamInfo;
  TA_InputParameterInfo *local_48;
  TA_OptInputParameterInfo *local_40;
  TA_OutputParameterInfo *local_38;
  
  uVar5 = 0;
  fprintf((FILE *)out,"%sTA_%s - %s\n"," * ",funcInfo->name,funcInfo->hint);
  fprintf((FILE *)out,"%s\n"," * ");
  fprintf((FILE *)out,"%sInput  = "," * ");
  if (funcInfo->nbInput != 0) {
    do {
      TVar3 = TA_GetInputParameterInfo(funcInfo->handle,uVar5,&local_48);
      if (TVar3 != TA_SUCCESS) {
        pcVar7 = funcInfo->name;
        pcVar8 = "[%s] invalid \'input\' information\n";
        goto LAB_0011722e;
      }
      TVar2 = local_48->type;
      if (TVar2 == TA_Input_Integer) {
        sVar6 = 3;
        pcVar7 = "int";
LAB_00116ec7:
        fwrite(pcVar7,sVar6,1,(FILE *)out);
      }
      else {
        if (TVar2 == TA_Input_Real) {
          sVar6 = 6;
          pcVar7 = "double";
          goto LAB_00116ec7;
        }
        if (TVar2 == TA_Input_Price) {
          uVar4 = local_48->flags;
          if ((uVar4 & 1) == 0) {
            if ((uVar4 & 2) != 0) {
LAB_00116d99:
              fwrite("High",4,1,(FILE *)out);
              uVar4 = local_48->flags;
              goto LAB_00116db9;
            }
            if ((uVar4 & 4) != 0) goto LAB_00116dd2;
            if ((uVar4 & 8) != 0) goto LAB_00116e0b;
            if ((uVar4 & 0x10) != 0) goto LAB_00116e44;
            if ((uVar4 & 0x20) != 0) goto LAB_00116e7d;
            if ((uVar4 & 0x40) == 0) goto LAB_00116ecf;
          }
          else {
            fwrite("Open",4,1,(FILE *)out);
            uVar4 = local_48->flags;
            if ((uVar4 & 2) != 0) {
              fwrite(", ",2,1,(FILE *)out);
              goto LAB_00116d99;
            }
LAB_00116db9:
            if ((uVar4 & 4) != 0) {
              fwrite(", ",2,1,(FILE *)out);
LAB_00116dd2:
              fwrite("Low",3,1,(FILE *)out);
              uVar4 = local_48->flags;
            }
            if ((uVar4 & 8) != 0) {
              fwrite(", ",2,1,(FILE *)out);
LAB_00116e0b:
              fwrite("Close",5,1,(FILE *)out);
              uVar4 = local_48->flags;
            }
            if ((uVar4 & 0x10) != 0) {
              fwrite(", ",2,1,(FILE *)out);
LAB_00116e44:
              fwrite("Volume",6,1,(FILE *)out);
              uVar4 = local_48->flags;
            }
            if ((uVar4 & 0x20) != 0) {
              fwrite(", ",2,1,(FILE *)out);
LAB_00116e7d:
              fwrite("OpenInterest",0xc,1,(FILE *)out);
              uVar4 = local_48->flags;
            }
            if ((uVar4 & 0x40) == 0) goto LAB_00116ecf;
            fwrite(", ",2,1,(FILE *)out);
          }
          sVar6 = 9;
          pcVar7 = "Timestamp";
          goto LAB_00116ec7;
        }
      }
LAB_00116ecf:
      uVar5 = uVar5 + 1;
      if (uVar5 == funcInfo->nbInput) {
        fputc(10,(FILE *)out);
      }
      else {
        fwrite(", ",2,1,(FILE *)out);
      }
    } while (uVar5 < funcInfo->nbInput);
  }
  uVar5 = 0;
  fprintf((FILE *)out,"%sOutput = "," * ");
  if (funcInfo->nbOutput != 0) {
    do {
      TVar3 = TA_GetOutputParameterInfo(funcInfo->handle,uVar5,&local_38);
      if (TVar3 != TA_SUCCESS) {
        pcVar7 = funcInfo->name;
        pcVar8 = "[%s] invalid \'output\' information\n";
        goto LAB_0011722e;
      }
      if (local_38->type == TA_Output_Integer) {
        sVar6 = 3;
        pcVar7 = "const int";
LAB_00116f80:
        fwrite(pcVar7 + 6,sVar6,1,(FILE *)out);
      }
      else if (local_38->type == TA_Output_Real) {
        sVar6 = 6;
        pcVar7 = "const double";
        goto LAB_00116f80;
      }
      uVar5 = uVar5 + 1;
      if (uVar5 == funcInfo->nbOutput) {
        fputc(10,(FILE *)out);
      }
      else {
        fwrite(", ",2,1,(FILE *)out);
      }
    } while (uVar5 < funcInfo->nbOutput);
  }
  if (funcInfo->nbOptInput != 0) {
    fprintf((FILE *)out,"%s\n"," * ");
    fprintf((FILE *)out,"%sOptional Parameters\n"," * ");
    fprintf((FILE *)out,"%s-------------------\n"," * ");
    if (funcInfo->nbOptInput != 0) {
      uVar5 = 0;
      do {
        TVar3 = TA_GetOptInputParameterInfo(funcInfo->handle,uVar5,&local_40);
        if (TVar3 != TA_SUCCESS) {
          pcVar7 = funcInfo->name;
          pcVar8 = "[%s] invalid \'optional input\' information\n";
LAB_0011722e:
          printf(pcVar8,pcVar7);
          return;
        }
        pcVar7 = local_40->paramName;
        if (3 < (ulong)local_40->type) {
          pcVar8 = "optInParam";
          if (pcVar7 != (char *)0x0) {
            pcVar8 = pcVar7;
          }
          printf("[%s,%s,%d] invalid \'optional input\' type(%d)\n",funcInfo->name,pcVar8,
                 (ulong)uVar5);
          return;
        }
        pcVar8 = &DAT_0011b080 + *(int *)(&DAT_0011b080 + (ulong)local_40->type * 4);
        if (pcVar7 != (char *)0x0) {
          pcVar8 = pcVar7;
        }
        fprintf((FILE *)out,"%s%s:"," * ",pcVar8);
        if (local_40->type == TA_OptInput_IntegerRange) {
          if (*local_40->dataSet == -0x7fffffff) {
            fwrite("(From TA_INTEGER_MIN",0x14,1,(FILE *)out);
          }
          else {
            fprintf((FILE *)out,"(From %d");
          }
          if (*(int *)((long)local_40->dataSet + 4) == 0x7fffffff) {
            sVar6 = 0x14;
            pcVar7 = " to TA_INTEGER_MAX)\n";
LAB_00117181:
            fwrite(pcVar7,sVar6,1,(FILE *)out);
          }
          else {
            fprintf((FILE *)out," to %d)\n");
          }
        }
        else if (local_40->type == TA_OptInput_RealRange) {
          dVar1 = *local_40->dataSet;
          if ((dVar1 != -3e+37) || (NAN(dVar1))) {
            fprintf((FILE *)out,"(From %.*g",(ulong)*(uint *)((long)local_40->dataSet + 0x10));
          }
          else {
            fwrite("(From TA_REAL_MIN",0x11,1,(FILE *)out);
          }
          dVar1 = *(double *)((long)local_40->dataSet + 8);
          if ((dVar1 == 3e+37) && (!NAN(dVar1))) {
            sVar6 = 0x11;
            pcVar7 = " to TA_REAL_MAX)\n";
            goto LAB_00117181;
          }
          pcVar7 = " %";
          if (((uint)local_40->flags >> 0x14 & 1) == 0) {
            pcVar7 = "";
          }
          fprintf((FILE *)out," to %.*g%s)\n",(ulong)*(uint *)((long)local_40->dataSet + 0x10),
                  pcVar7);
        }
        else {
          fputc(10,(FILE *)out);
        }
        fprintf((FILE *)out,"%s   %s\n"," * ",local_40->hint);
        fprintf((FILE *)out,"%s\n"," * ");
        uVar5 = uVar5 + 1;
      } while (uVar5 < funcInfo->nbOptInput);
    }
  }
  fprintf((FILE *)out,"%s\n"," * ");
  return;
}

Assistant:

static void printFuncHeaderDoc( FILE *out,
                                const TA_FuncInfo *funcInfo,
                                const char *prefix )
{
   TA_RetCode retCode;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   const TA_InputParameterInfo *inputParamInfo;
   const TA_OptInputParameterInfo *optInputParamInfo;
   const TA_OutputParameterInfo *outputParamInfo;
   int first;

   fprintf( out, "%sTA_%s - %s\n", prefix, funcInfo->name, funcInfo->hint );
   fprintf( out, "%s\n", prefix );


   fprintf( out, "%sInput  = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbInput; paramNb++ )
   {
      retCode = TA_GetInputParameterInfo( funcInfo->handle,
                                          paramNb, &inputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'input' information\n", funcInfo->name );
         return;
      }

      switch( inputParamInfo->type )
      {
      case TA_Input_Price:
         first = 1;
         #define PRICE_PARAM(upperParam,lowerParam) \
         { \
            if( inputParamInfo->flags & TA_IN_PRICE_##upperParam ) \
            { \
               if( !first ) fprintf( out, ", " ); \
               fprintf( out, lowerParam ); \
               first = 0; \
            } \
         }

         PRICE_PARAM( OPEN,         "Open" );
         PRICE_PARAM( HIGH,         "High" );
         PRICE_PARAM( LOW,          "Low" );
         PRICE_PARAM( CLOSE,        "Close" );
         PRICE_PARAM( VOLUME,       "Volume" );
         PRICE_PARAM( OPENINTEREST, "OpenInterest" );
         PRICE_PARAM( TIMESTAMP,    "Timestamp" );

         #undef PRICE_PARAM

         break;
      case TA_Input_Integer:
         fprintf( out, "int" );
         break;
      case TA_Input_Real:
         fprintf( out, "double" );
         break;
      }
      if( paramNb+1 == funcInfo->nbInput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   fprintf( out, "%sOutput = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbOutput; paramNb++ )
   {
      retCode = TA_GetOutputParameterInfo( funcInfo->handle,
                                           paramNb, &outputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'output' information\n", funcInfo->name );
         return;
      }

      switch( outputParamInfo->type )
      {
      case TA_Output_Real:
         fprintf( out, "double" );
         break;
      case TA_Output_Integer:
         fprintf( out, "int" );
         break;
      }
      if( paramNb+1 == funcInfo->nbOutput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   if( funcInfo->nbOptInput != 0 )
   {
      fprintf( out, "%s\n", prefix );
      fprintf( out, "%sOptional Parameters\n", prefix );
      fprintf( out, "%s-------------------\n", prefix );

      for( paramNb=0; paramNb < funcInfo->nbOptInput; paramNb++ )
      {
         retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                                paramNb, &optInputParamInfo );

         if( retCode != TA_SUCCESS )
         {
            printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
            return;
         }

         paramName = optInputParamInfo->paramName;

         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
         case TA_OptInput_RealList:
            defaultParamName = "optInReal";
            break;
         case TA_OptInput_IntegerRange:
         case TA_OptInput_IntegerList:
            defaultParamName = "optInInteger";
            break;
         default:
            if( !paramName )
               paramName = "optInParam";
            printf( "[%s,%s,%d] invalid 'optional input' type(%d)\n",
                    funcInfo->name, paramName, paramNb,
                    optInputParamInfo->type );
            return;
         }

         if( !paramName )
            paramName = defaultParamName;

         fprintf( out, "%s%s:", prefix, paramName );
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->min == TA_REAL_MIN )
                  fprintf( out, "(From TA_REAL_MIN" );
               else
               {
                  fprintf( out, "(From %.*g",
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->max == TA_REAL_MAX )
                  fprintf( out, " to TA_REAL_MAX)\n" );
               else
               {
                  fprintf( out, " to %.*g%s)\n",
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->max,
                          optInputParamInfo->flags & TA_OPTIN_IS_PERCENT? " %":"" );
               }
               break;
         case TA_OptInput_IntegerRange:
               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min == TA_INTEGER_MIN )
                  fprintf( out, "(From TA_INTEGER_MIN" );
               else
               {
                  fprintf( out, "(From %d",
                           ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max == TA_INTEGER_MAX )
                  fprintf( out, " to TA_INTEGER_MAX)\n" );
               else
               {
                  fprintf( out, " to %d)\n",
                          ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max );
               }
               break;
         default:
             fprintf( out, "\n" );
         }
         fprintf( out, "%s   %s\n", prefix, optInputParamInfo->hint );
         fprintf( out, "%s\n", prefix );
      }
   }

   fprintf( out, "%s\n", prefix );
}